

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_trotter.cpp
# Opt level: O0

void trotter<std::complex<float>>
               (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *circuit)

{
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *pQVar1;
  __type _Var2;
  float local_104;
  float local_fc;
  unique_ptr<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
  local_f8;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  local_f0;
  float local_e4;
  unique_ptr<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
  local_e0;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  local_d8;
  int local_cc;
  unique_ptr<qclab::qgates::CX<std::complex<float>_>,_std::default_delete<qclab::qgates::CX<std::complex<float>_>_>_>
  local_c8;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  local_c0;
  float local_b4;
  unique_ptr<qclab::qgates::RotationZ<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
  local_b0;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  local_a8;
  unique_ptr<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
  local_a0;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  local_98;
  int local_8c;
  unique_ptr<qclab::qgates::CX<std::complex<float>_>,_std::default_delete<qclab::qgates::CX<std::complex<float>_>_>_>
  local_88;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  local_80;
  float local_78;
  float local_74;
  unique_ptr<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
  local_70;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  local_68;
  float local_5c;
  unique_ptr<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
  local_58;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  local_50;
  float local_48 [2];
  int i_1;
  unique_ptr<qclab::qgates::RotationZ<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
  local_38;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  local_30;
  float local_28;
  float local_24;
  int i;
  int os_c;
  int os;
  int lyr;
  int n;
  R pi;
  QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *circuit_local;
  
  _n = circuit;
  _Var2 = std::atan<int>(1);
  lyr = (int)(float)(_Var2 * 4.0);
  os = (**(_n->super_QObject<std::complex<float>_>)._vptr_QObject)();
  for (os_c = 0; os_c < os; os_c = os_c + 1) {
    local_28 = (float)(uint)(os_c % 2 != 0);
    local_104 = local_28;
    if (os % 2 != 0) {
      local_104 = (float)(1 - (int)local_28);
    }
    local_24 = local_104;
    i = (int)local_28;
    for (; pQVar1 = _n, (int)local_28 < os - (int)local_24; local_28 = (float)((int)local_28 + 1)) {
      std::make_unique<qclab::qgates::RotationZ<std::complex<float>>,int&,float_const&>
                ((int *)&local_38,&local_28);
      std::
      unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
      ::
      unique_ptr<qclab::qgates::RotationZ<std::complex<float>>,std::default_delete<qclab::qgates::RotationZ<std::complex<float>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                  *)&local_30,&local_38);
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (pQVar1,&local_30);
      std::
      unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      ::~unique_ptr(&local_30);
      std::
      unique_ptr<qclab::qgates::RotationZ<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
      ::~unique_ptr(&local_38);
    }
    for (local_48[0] = (float)i; pQVar1 = _n, (int)local_48[0] < (os - (int)local_24) + -1;
        local_48[0] = (float)((int)local_48[0] + 2)) {
      local_5c = (float)lyr * 0.5;
      std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int&,float>
                ((int *)&local_58,local_48);
      std::
      unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
      ::
      unique_ptr<qclab::qgates::RotationX<std::complex<float>>,std::default_delete<qclab::qgates::RotationX<std::complex<float>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                  *)&local_50,&local_58);
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (pQVar1,&local_50);
      std::
      unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      ::~unique_ptr(&local_50);
      std::
      unique_ptr<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
      ::~unique_ptr(&local_58);
      pQVar1 = _n;
      local_74 = (float)((int)local_48[0] + 1);
      local_78 = (float)lyr * 0.5;
      std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int,float>
                ((int *)&local_70,&local_74);
      std::
      unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
      ::
      unique_ptr<qclab::qgates::RotationX<std::complex<float>>,std::default_delete<qclab::qgates::RotationX<std::complex<float>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                  *)&local_68,&local_70);
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (pQVar1,&local_68);
      std::
      unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      ::~unique_ptr(&local_68);
      std::
      unique_ptr<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
      ::~unique_ptr(&local_70);
      pQVar1 = _n;
      local_8c = (int)local_48[0] + 1;
      std::make_unique<qclab::qgates::CX<std::complex<float>>,int&,int>
                ((int *)&local_88,(int *)local_48);
      std::
      unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
      ::
      unique_ptr<qclab::qgates::CX<std::complex<float>>,std::default_delete<qclab::qgates::CX<std::complex<float>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                  *)&local_80,&local_88);
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (pQVar1,&local_80);
      std::
      unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      ::~unique_ptr(&local_80);
      std::
      unique_ptr<qclab::qgates::CX<std::complex<float>_>,_std::default_delete<qclab::qgates::CX<std::complex<float>_>_>_>
      ::~unique_ptr(&local_88);
      pQVar1 = _n;
      std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int&,float_const&>
                ((int *)&local_a0,local_48);
      std::
      unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
      ::
      unique_ptr<qclab::qgates::RotationX<std::complex<float>>,std::default_delete<qclab::qgates::RotationX<std::complex<float>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                  *)&local_98,&local_a0);
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (pQVar1,&local_98);
      std::
      unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      ::~unique_ptr(&local_98);
      std::
      unique_ptr<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
      ::~unique_ptr(&local_a0);
      pQVar1 = _n;
      local_b4 = (float)((int)local_48[0] + 1);
      std::make_unique<qclab::qgates::RotationZ<std::complex<float>>,int,float_const&>
                ((int *)&local_b0,&local_b4);
      std::
      unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
      ::
      unique_ptr<qclab::qgates::RotationZ<std::complex<float>>,std::default_delete<qclab::qgates::RotationZ<std::complex<float>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                  *)&local_a8,&local_b0);
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (pQVar1,&local_a8);
      std::
      unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      ::~unique_ptr(&local_a8);
      std::
      unique_ptr<qclab::qgates::RotationZ<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
      ::~unique_ptr(&local_b0);
      pQVar1 = _n;
      local_cc = (int)local_48[0] + 1;
      std::make_unique<qclab::qgates::CX<std::complex<float>>,int&,int>
                ((int *)&local_c8,(int *)local_48);
      std::
      unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
      ::
      unique_ptr<qclab::qgates::CX<std::complex<float>>,std::default_delete<qclab::qgates::CX<std::complex<float>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                  *)&local_c0,&local_c8);
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (pQVar1,&local_c0);
      std::
      unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      ::~unique_ptr(&local_c0);
      std::
      unique_ptr<qclab::qgates::CX<std::complex<float>_>,_std::default_delete<qclab::qgates::CX<std::complex<float>_>_>_>
      ::~unique_ptr(&local_c8);
      pQVar1 = _n;
      local_e4 = (float)lyr * -0.5;
      std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int&,float>
                ((int *)&local_e0,local_48);
      std::
      unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
      ::
      unique_ptr<qclab::qgates::RotationX<std::complex<float>>,std::default_delete<qclab::qgates::RotationX<std::complex<float>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                  *)&local_d8,&local_e0);
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (pQVar1,&local_d8);
      std::
      unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      ::~unique_ptr(&local_d8);
      std::
      unique_ptr<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
      ::~unique_ptr(&local_e0);
      pQVar1 = _n;
      local_fc = (float)((int)local_48[0] + 1);
      std::make_unique<qclab::qgates::RotationX<std::complex<float>>,int,float>
                ((int *)&local_f8,&local_fc);
      std::
      unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
      ::
      unique_ptr<qclab::qgates::RotationX<std::complex<float>>,std::default_delete<qclab::qgates::RotationX<std::complex<float>>>,void>
                ((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                  *)&local_f0,&local_f8);
      qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::push_back
                (pQVar1,&local_f0);
      std::
      unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
      ::~unique_ptr(&local_f0);
      std::
      unique_ptr<qclab::qgates::RotationX<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationX<std::complex<float>_>_>_>
      ::~unique_ptr(&local_f8);
    }
  }
  return;
}

Assistant:

void trotter( qclab::QCircuit< T >& circuit ) {

  using R  = qclab::real_t< T > ;
  using RX = qclab::qgates::RotationX< T > ;
  using RZ = qclab::qgates::RotationZ< T > ;
  using CX = qclab::qgates::CNOT< T > ;

  // constants
  const R pi = 4 * std::atan(1) ;
  const int n = circuit.nbQubits() ;

  // layers
  for ( int lyr = 0; lyr < n; lyr++ ) {
    int os = ( lyr % 2 ) ? 1 : 0 ;        // offset at bottom
    int os_c = ( n % 2 ) ? 1 - os : os ;  // offset at top
    for ( int i = os; i < n - os_c; i++ ) {
      circuit.push_back( std::make_unique< RZ >( i , pi ) ) ;
    }
    for ( int i = os; i < n - os_c - 1; i += 2 ) {
      circuit.push_back( std::make_unique< RX >( i     , pi/2 ) ) ;
      circuit.push_back( std::make_unique< RX >( i + 1 , pi/2 ) ) ;
      circuit.push_back( std::make_unique< CX >( i , i + 1 ) ) ;
      circuit.push_back( std::make_unique< RX >( i     , pi ) ) ;
      circuit.push_back( std::make_unique< RZ >( i + 1 , pi ) ) ;
      circuit.push_back( std::make_unique< CX >( i , i + 1 ) ) ;
      circuit.push_back( std::make_unique< RX >( i     , -pi/2 ) ) ;
      circuit.push_back( std::make_unique< RX >( i + 1 , -pi/2 ) ) ;
    }
  }

}